

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerResults.cpp
# Opt level: O3

void __thiscall
PS2KeyboardAnalyzerResults::GenerateFrameTabularText
          (PS2KeyboardAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  double dVar1;
  undefined4 uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  char *__format;
  byte bVar7;
  PS2KeyboardAnalyzerResults *this_00;
  PS2KeyboardAnalyzerSettings *pPVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  byte bVar12;
  char codetype [32];
  char device_str [16];
  Frame frame;
  PS2KeyboardAnalyzerSettings *local_4d0;
  PS2KeyboardAnalyzer *local_4c8;
  byte local_4bf;
  char key_str [64];
  char tmp_str [128];
  char num_str [128];
  char result_str [255];
  
  AnalyzerResults::ClearTabularText();
  this_00 = (PS2KeyboardAnalyzerResults *)&frame;
  AnalyzerResults::GetFrame((ulonglong)this_00);
  if ((local_4bf & 1) != 0) {
    device_str._4_4_ = device_str._4_4_ & 0xffffff00;
    builtin_strncpy(device_str,"Host",4);
    pPVar8 = local_4d0;
    AnalyzerHelpers::GetNumberString((ulonglong)local_4d0,Hexadecimal,8,num_str,0x20);
    GetCommandName((PS2KeyboardAnalyzerResults *)pPVar8,tmp_str,(U64)local_4d0,
                   this->mSettings->mDeviceType);
    sprintf(result_str,"%s: %s (%s)",device_str);
    AnalyzerResults::AddTabularText
              ((char *)this,result_str,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    goto LAB_0010934b;
  }
  dVar1 = this->mSettings->mDeviceType;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    builtin_strncpy(device_str,"Mouse",6);
    uVar2 = device_str._0_4_;
    device_str._0_8_ = CONCAT44(device_str._4_4_,uVar2);
    GetKeyName(this_00,result_str,(U64)local_4d0,local_4bf & 8);
    if ((local_4bf & 2) == 0) {
      if ((local_4bf & 0x20) == 0) {
        AnalyzerHelpers::GetNumberString((ulonglong)local_4d0,Hexadecimal,8,key_str,0x80);
        strcpy(num_str,key_str);
        result_str._0_8_ = result_str._0_8_ & 0xffffffffffffff00;
      }
      else {
        AnalyzerHelpers::GetNumberString((ulonglong)local_4d0,Hexadecimal,0x20,key_str,0x80);
        strcpy(num_str,key_str);
        uVar3 = ((ulong)local_4d0 & 0xffffffff) >> 7 & 1;
        bVar4 = (byte)(((ulong)local_4d0 & 0xffffffff) >> 6) & 1;
        bVar6 = (byte)(((ulong)local_4d0 & 0xffffffff) >> 5) & 1;
        bVar7 = (byte)(((ulong)local_4d0 & 0xffffffff) >> 4) & 1;
        bVar5 = (byte)(((ulong)local_4d0 & 0xffffffff) >> 2) & 1;
        bVar12 = (byte)(((ulong)local_4d0 & 0xffffffff) >> 1) & 1;
        bVar11 = (byte)local_4d0 & 1;
        dVar1 = this->mSettings->mDeviceType;
        uVar9 = (uint)((ulong)local_4d0 >> 8);
        uVar10 = (uint)((ulong)local_4d0 >> 0x10);
        if ((dVar1 != 1.0) || (NAN(dVar1))) {
          sprintf(result_str,
                  "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, 4th Btn: %d, 5th Btn: %d, deltaX: %d, deltaY: %d, deltaZ: %d"
                  ,uVar3,(ulong)bVar4,(ulong)bVar6,(ulong)bVar7,(ulong)bVar5,(ulong)bVar12,
                  (ulong)bVar11,0,(ulong)((uint)((ulong)local_4d0 >> 0x1d) & 1),
                  (ulong)(uVar9 & 0xff),(ulong)(uVar10 & 0xff),
                  (ulong)((uint)local_4d0 >> 0x18 & 0xf));
        }
        else {
          sprintf(result_str,
                  "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, deltaX: %d, deltaY: %d"
                  ,uVar3,(ulong)bVar4,(ulong)bVar6,(ulong)bVar7,(ulong)bVar5,(ulong)bVar12,
                  (ulong)bVar11,(ulong)(uVar9 & 0xff),(ulong)(uVar10 & 0xff));
        }
      }
    }
    else if (((ulong)local_4c8 & 1) == 0) {
      if (((ulong)local_4c8 & 4) != 0) {
        AnalyzerHelpers::GetNumberString((ulonglong)local_4d0,Hexadecimal,8,key_str,0x80);
        strcpy(num_str,key_str);
        builtin_strncpy(result_str,"Power-On Self Test Successfull",0x1f);
      }
    }
    else {
      AnalyzerHelpers::GetNumberString((ulonglong)local_4d0,Hexadecimal,8,key_str,0x80);
      strcpy(num_str,key_str);
      result_str._0_8_ = result_str._0_8_ & 0xffffffffffffff00;
    }
    strcpy(key_str,num_str);
    sprintf(tmp_str,"%s: %s %s (%s)",device_str);
    AnalyzerResults::AddTabularText
              ((char *)this,tmp_str,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    goto LAB_0010934b;
  }
  builtin_strncpy(device_str,"Keyboard",9);
  pPVar8 = local_4d0;
  AnalyzerHelpers::GetNumberString((ulonglong)local_4d0,Hexadecimal,8,num_str,0x20);
  GetKeyName((PS2KeyboardAnalyzerResults *)pPVar8,key_str,(U64)local_4d0,local_4bf & 8);
  if ((local_4bf & 2) == 0) {
    if ((char)local_4bf < '\0') {
      strcpy(tmp_str,num_str);
      builtin_strncpy(key_str,"INVALID CODE",0xd);
    }
    else if (local_4bf < 0x40) {
      if ((local_4bf & 0x10) == 0 || local_4bf < 0x20) {
        if (local_4bf < 0x20) {
          if ((~local_4bf & 0x18) == 0) {
            __format = "0xE0, 0xF0, %s";
LAB_00108d54:
            sprintf(tmp_str,__format,num_str);
          }
          else if ((local_4bf & 8) == 0) {
            if ((local_4bf & 0x10) != 0) {
              __format = "0xF0, %s";
              goto LAB_00108d54;
            }
            strcpy(tmp_str,num_str);
          }
          else {
            sprintf(tmp_str,"0xE0, %s",num_str);
          }
          goto LAB_001092eb;
        }
        builtin_strncpy(tmp_str + 8,"12, 0xE0, 0x7C",0xf);
      }
      else {
        builtin_strncpy(tmp_str + 8,"F0, 0x7C, 0xE0, 0xF0, 0x12",0x1b);
      }
      builtin_strncpy(tmp_str,"0xE0, 0x",8);
      builtin_strncpy(key_str,"[PRINT SCREEN]",0xf);
    }
    else {
      builtin_strncpy(tmp_str + 0x23," 0xF0, 0x77",0xc);
      builtin_strncpy(tmp_str,"0xE1, 0x14, 0x77, 0xE1, 0xF0, 0x14,",0x23);
      builtin_strncpy(key_str,"[PAUSE/BREAK]",0xe);
    }
  }
  else if (((ulong)local_4c8 & 1) == 0) {
    if (((ulong)local_4c8 & 2) == 0) {
      if (((ulong)local_4c8 & 4) != 0) {
        strcpy(tmp_str,num_str);
        builtin_strncpy(key_str,"Power-On Self Test Successfull",0x1f);
      }
    }
    else {
      strcpy(tmp_str,num_str);
      key_str[0] = '\0';
    }
  }
  else {
    strcpy(tmp_str,num_str);
    key_str[0] = '\0';
  }
LAB_001092eb:
  strcpy(num_str,tmp_str);
  sprintf(result_str,"%s: %s %s (%s)",device_str);
  AnalyzerResults::AddTabularText
            ((char *)this,result_str,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0010934b:
  Frame::~Frame(&frame);
  return;
}

Assistant:

void PS2KeyboardAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();
    Frame frame = GetFrame( frame_index );

    char device_str[ 16 ];
    if( frame.mFlags & TX_HOST_TO_DEVICE )
    {
        sprintf( device_str, "Host" );

        char num_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 32 );

        char cmd_str[ 64 ];
        GetCommandName( cmd_str, frame.mData1, mSettings->mDeviceType );

        char result_str[ 255 ];

        sprintf( result_str, "%s: %s (%s)", device_str, cmd_str, num_str );
        AddTabularText( result_str );
    }
    else
    {
        if( mSettings->mDeviceType == 0 )
        {
            sprintf( device_str, "Keyboard" );

            char num_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 32 );

            char tmp_str[ 128 ];
            char codetype[ 32 ];

            char key_str[ 64 ];
            GetKeyName( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );


            if( frame.mFlags & DATA_FRAME )
            {
                if( frame.mData2 & ACK_FRAME )
                {
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "ACK" );
                    sprintf( key_str, "" );
                }
                else if( frame.mData2 & ECHO_FRAME )
                {
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "ECHO" );

                    sprintf( key_str, "" );
                }
                else if( frame.mData2 & BAT_FRAME )
                {
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "BAT" );

                    sprintf( key_str, "Power-On Self Test Successfull" );
                }
            }
            else if( frame.mFlags & ERROR_FRAME )
            {
                sprintf( tmp_str, "%s", num_str );
                sprintf( codetype, "ERROR" );
                sprintf( key_str, "INVALID CODE" );
            }
            else if( frame.mFlags & PAUSE_BREAK )
            {
                sprintf( tmp_str, "0xE1, 0x14, 0x77, 0xE1, 0xF0, 0x14, 0xF0, 0x77" );
                sprintf( codetype, "" );
                sprintf( key_str, "[PAUSE/BREAK]" );
            }
            else if( frame.mFlags & PRINT_SCREEN && frame.mFlags & BREAK_CODE )
            {
                sprintf( tmp_str, "0xE0, 0xF0, 0x7C, 0xE0, 0xF0, 0x12" );
                sprintf( codetype, "BREAK" );
                sprintf( key_str, "[PRINT SCREEN]" );
            }
            else if( frame.mFlags & PRINT_SCREEN )
            {
                sprintf( tmp_str, "0xE0, 0x12, 0xE0, 0x7C" );
                sprintf( codetype, "MAKE" );
                sprintf( key_str, "[PRINT SCREEN]" );
            }
            else if( frame.mFlags & EXTENDED_KEY && frame.mFlags & BREAK_CODE )
            {
                sprintf( tmp_str, "0xE0, 0xF0, %s", num_str );
                sprintf( codetype, "BREAK" );
            }
            else if( frame.mFlags & EXTENDED_KEY )
            {
                sprintf( tmp_str, "0xE0, %s", num_str );
                sprintf( codetype, "MAKE" );
            }
            else if( frame.mFlags & BREAK_CODE )
            {
                sprintf( tmp_str, "0xF0, %s", num_str );
                sprintf( codetype, "BREAK" );
            }
            else
            {
                sprintf( tmp_str, "%s", num_str );
                sprintf( codetype, "MAKE" );
            }

            sprintf( num_str, "%s", tmp_str );

            char result_str[ 255 ];

            // at next zoom show originator and raw hex
            sprintf( result_str, "%s: %s %s (%s)", device_str, codetype, key_str, num_str );
            AddTabularText( result_str );
        }
        else
        {
            sprintf( device_str, "Mouse" );

            char num_str[ 128 ];

            char tmp_str[ 256 ];
            char codetype[ 32 ];

            char key_str[ 512 ];
            GetKeyName( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );

            if( frame.mFlags & DATA_FRAME )
            {
                if( frame.mData2 & ACK_FRAME )
                {
                    AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "ACK" );
                    sprintf( key_str, "" );
                }
                else if( frame.mData2 & BAT_FRAME )
                {
                    AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                    sprintf( tmp_str, "%s", num_str );
                    sprintf( codetype, "BAT" );

                    sprintf( key_str, "Power-On Self Test Successfull" );
                }
            }
            else if( frame.mFlags & MOVEMENT_FRAME )
            {
                AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 32, num_str, 128 );
                sprintf( tmp_str, "%s", num_str );
                sprintf( codetype, "MOVEMENT" );

                U8 YOverflow = ( frame.mData1 & 0x80 ) >> 7;
                U8 XOverflow = ( frame.mData1 & 0x40 ) >> 6;
                U8 YSignBit = ( frame.mData1 & 0x20 ) >> 5;
                U8 XSignBit = ( frame.mData1 & 0x10 ) >> 4;
                U8 MiddleButton = ( frame.mData1 & 0x04 ) >> 2;
                U8 RightButton = ( frame.mData1 & 0x02 ) >> 1;
                U8 LeftButton = frame.mData1 & 0x01;

                U8 Xmovement = ( frame.mData1 & 0xFF00 ) >> 8;
                U8 Ymovement = ( frame.mData1 & 0xFF0000 ) >> 16;

                if( mSettings->mDeviceType == 1 )
                    sprintf( key_str,
                             "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, "
                             "deltaX: %d, deltaY: %d",
                             YOverflow, XOverflow, YSignBit, XSignBit, MiddleButton, RightButton, LeftButton, Xmovement, Ymovement );
                else
                {
                    U8 FifthButton = ( frame.mData1 & 0x20000000 ) >> 29;
                    U8 FourthButton = ( frame.mData1 & 0x1000000 ) >> 28;
                    U8 Zmovement = ( frame.mData1 & 0x0F000000 ) >> 24;

                    sprintf( key_str,
                             "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, "
                             "4th Btn: %d, 5th Btn: %d, deltaX: %d, deltaY: %d, deltaZ: %d",
                             YOverflow, XOverflow, YSignBit, XSignBit, MiddleButton, RightButton, LeftButton, FourthButton, FifthButton,
                             Xmovement, Ymovement, Zmovement );
                }
            }
            else
            {
                AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                sprintf( tmp_str, "%s", num_str );
                sprintf( codetype, "DATA" );

                sprintf( key_str, "" );
            }
            sprintf( num_str, "%s", tmp_str );

            char result_str[ 255 ];
            sprintf( result_str, "%s: %s %s (%s)", device_str, codetype, key_str, num_str );
            AddTabularText( result_str );
        }
    }
}